

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O0

void __thiscall
TCPSocket::TCPSocketError::TCPSocketError(TCPSocketError *this,string *reason,int errorCode)

{
  __cxx11 local_90 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [36];
  int local_1c;
  string *psStack_18;
  int errorCode_local;
  string *reason_local;
  TCPSocketError *this_local;
  
  local_1c = errorCode;
  psStack_18 = reason;
  reason_local = (string *)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__TCPSocketError_00242630;
  std::operator+(local_60,(char *)reason);
  std::__cxx11::to_string(local_90,this->code);
  std::operator+(local_40,local_60);
  std::operator+(&this->reason,(char *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_60);
  this->code = local_1c;
  return;
}

Assistant:

TCPSocketError(std::string reason, int errorCode = 0) : reason(reason + " (" + std::to_string(code) + ")"), code(errorCode){}